

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_6e3e3::lower_shared_reference_visitor::visit_enter
          (lower_shared_reference_visitor *this,ir_assignment *ir)

{
  exec_node *peVar1;
  ir_rvalue *deref;
  ir_instruction *piVar2;
  int iVar3;
  ir_visitor_status iVar4;
  undefined4 extraout_var;
  void *pvVar5;
  ir_variable *this_00;
  ir_dereference_variable *this_01;
  ir_variable *piVar6;
  ir_assignment *piVar7;
  bool row_major;
  uint const_offset;
  glsl_type *local_58;
  void *local_50;
  ir_rvalue *offset;
  glsl_type *matrix_type;
  deref local_38;
  
  if (((ir != (ir_assignment *)0x0) &&
      (deref = &ir->lhs->super_ir_rvalue, deref != (ir_rvalue *)0x0)) &&
     ((deref->super_ir_instruction).ir_type < ir_type_constant)) {
    iVar3 = (*(deref->super_ir_instruction)._vptr_ir_instruction[8])(deref);
    piVar6 = (ir_variable *)CONCAT44(extraout_var,iVar3);
    if ((piVar6 != (ir_variable *)0x0) &&
       (((undefined1  [44])piVar6->data & (undefined1  [44])0xf000) == (undefined1  [44])0x3000)) {
      *(undefined4 *)
       &(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.super_ir_rvalue_base_visitor
        .super_ir_hierarchical_visitor.field_0x34 = 1;
      pvVar5 = ralloc_parent(this->shader->ir);
      local_58 = deref->type;
      this_00 = (ir_variable *)exec_node::operator_new(0x90,pvVar5);
      ir_variable::ir_variable(this_00,local_58,"shared_store_temp",ir_var_temporary);
      piVar2 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
               super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
      peVar1 = &(this_00->super_ir_instruction).super_exec_node;
      (this_00->super_ir_instruction).super_exec_node.next = &piVar2->super_exec_node;
      (this_00->super_ir_instruction).super_exec_node.prev = (piVar2->super_exec_node).prev;
      ((piVar2->super_exec_node).prev)->next = peVar1;
      (piVar2->super_exec_node).prev = peVar1;
      local_50 = pvVar5;
      this_01 = (ir_dereference_variable *)exec_node::operator_new(0x30,pvVar5);
      ir_dereference_variable::ir_dereference_variable(this_01,this_00);
      ir->lhs = (ir_dereference *)this_01;
      offset = (ir_rvalue *)0x0;
      const_offset = get_shared_offset(this,piVar6);
      pvVar5 = local_50;
      if (piVar6->interface_type != (glsl_type *)0x0) {
        __assert_fail("var->get_interface_type() == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_shared_reference.cpp"
                      ,0xd2,
                      "void (anonymous namespace)::lower_shared_reference_visitor::handle_assignment(ir_assignment *)"
                     );
      }
      lower_buffer_access::lower_buffer_access::setup_buffer_access
                (&this->super_lower_buffer_access,local_50,deref,&offset,&const_offset,&row_major,
                 &matrix_type,(glsl_struct_field **)0x0,GLSL_INTERFACE_PACKING_STD430);
      local_58 = (glsl_type *)exec_node::operator_new(0x30,pvVar5);
      ir_dereference_variable::ir_dereference_variable((ir_dereference_variable *)local_58,this_00);
      piVar6 = (ir_variable *)exec_node::operator_new(0x90,pvVar5);
      ir_variable::ir_variable
                (piVar6,&glsl_type::_uint_type,"shared_store_temp_offset",ir_var_temporary);
      piVar2 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
               super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
      peVar1 = &(piVar6->super_ir_instruction).super_exec_node;
      (piVar6->super_ir_instruction).super_exec_node.next = &piVar2->super_exec_node;
      (piVar6->super_ir_instruction).super_exec_node.prev = (piVar2->super_exec_node).prev;
      ((piVar2->super_exec_node).prev)->next = peVar1;
      (piVar2->super_exec_node).prev = peVar1;
      ir_builder::deref::deref(&local_38,piVar6);
      piVar7 = ir_builder::assign(local_38,(operand)offset);
      if (piVar7 != (ir_assignment *)0x0) {
        piVar7 = (ir_assignment *)&(piVar7->super_ir_instruction).super_exec_node;
      }
      (piVar7->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&piVar2->super_exec_node;
      (piVar7->super_ir_instruction).super_exec_node.next = (piVar2->super_exec_node).prev;
      ((piVar2->super_exec_node).prev)->next = (exec_node *)piVar7;
      (piVar2->super_exec_node).prev = (exec_node *)piVar7;
      lower_buffer_access::lower_buffer_access::emit_access
                (&this->super_lower_buffer_access,local_50,true,(ir_dereference *)local_58,piVar6,
                 const_offset,row_major,matrix_type,GLSL_INTERFACE_PACKING_STD430,
                 (byte)ir->field_0x38 & 0xf);
      this->progress = true;
    }
  }
  iVar4 = ir_rvalue_base_visitor::rvalue_visit((ir_rvalue_base_visitor *)this,ir);
  return iVar4;
}

Assistant:

ir_visitor_status
lower_shared_reference_visitor::visit_enter(ir_assignment *ir)
{
   handle_assignment(ir);
   return rvalue_visit(ir);
}